

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listelem_alloc.c
# Opt level: O1

void listelem_alloc_free(listelem_alloc_t *list)

{
  glist_t pgVar1;
  
  if (list != (listelem_alloc_t *)0x0) {
    for (pgVar1 = list->blocks; pgVar1 != (glist_t)0x0; pgVar1 = pgVar1->next) {
      ckd_free((pgVar1->data).ptr);
    }
    glist_free(list->blocks);
    glist_free(list->blocksize);
    ckd_free(list);
    return;
  }
  return;
}

Assistant:

void
listelem_alloc_free(listelem_alloc_t *list)
{
    gnode_t *gn;
    if (list == NULL)
	return;
    for (gn = list->blocks; gn; gn = gnode_next(gn))
	ckd_free(gnode_ptr(gn));
    glist_free(list->blocks);
    glist_free(list->blocksize);
    ckd_free(list);
}